

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

void btDbvt::rayTest(btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,ICollide *policy)

{
  btDbvtNode *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  btVector3 bVar12;
  btScalar tmin;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btDbvtNode *local_a0;
  ulong local_98;
  uint local_90;
  btVector3 rayDirectionInverse;
  btVector3 bounds [2];
  btVector3 rayDir;
  
  if (root != (btDbvtNode *)0x0) {
    rayDir = operator-(rayTo,rayFrom);
    btVector3::normalize(&rayDir);
    bVar12.m_floats = rayDir.m_floats;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = rayDir.m_floats[0];
    auVar11._4_4_ = rayDir.m_floats[1];
    auVar11 = divps(_DAT_001af400,auVar11);
    uVar6 = -(uint)(bVar12.m_floats[0] == 0.0);
    uVar7 = -(uint)(bVar12.m_floats[1] == 0.0);
    rayDirectionInverse.m_floats[0] = (btScalar)(uVar6 & 0x5d5e0b6b | ~uVar6 & auVar11._0_4_);
    rayDirectionInverse.m_floats[1] = (btScalar)(uVar7 & 0x5d5e0b6b | ~uVar7 & auVar11._4_4_);
    rayDir.m_floats[2] = bVar12.m_floats[2];
    rayDirectionInverse.m_floats[2] =
         (btScalar)
         (-(uint)(rayDir.m_floats[2] == 0.0) & 0x5d5e0b6b |
         ~-(uint)(rayDir.m_floats[2] == 0.0) & (uint)(1.0 / rayDir.m_floats[2]));
    local_98 = CONCAT44(-(uint)(rayDirectionInverse.m_floats[1] < 0.0),
                        -(uint)(rayDirectionInverse.m_floats[0] < 0.0)) & 0x100000001;
    local_90 = (uint)(rayDirectionInverse.m_floats[2] < 0.0);
    rayDir.m_floats = bVar12.m_floats;
    bVar12 = operator-(rayTo,rayFrom);
    fVar9 = bVar12.m_floats[1] * rayDir.m_floats[1];
    fVar8 = bVar12.m_floats[2] * rayDir.m_floats[2];
    stack.m_ownsMemory = true;
    stack.m_data = (btDbvtNode **)0x0;
    fVar10 = rayDir.m_floats[0] * bVar12.m_floats[0];
    stack.m_size = 0;
    stack.m_capacity = 0;
    bounds[0].m_floats[0] = 0.0;
    bounds[0].m_floats[1] = 0.0;
    btAlignedObjectArray<const_btDbvtNode_*>::resize(&stack,0x80,(btDbvtNode **)bounds);
    *stack.m_data = root;
    iVar3 = 0x7e;
    iVar4 = 1;
    do {
      pbVar1 = stack.m_data[(long)iVar4 + -1];
      bounds[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->volume).mi.m_floats;
      bounds[0].m_floats._8_8_ = *(undefined8 *)((pbVar1->volume).mi.m_floats + 2);
      bounds[1].m_floats._0_8_ = *(undefined8 *)(pbVar1->volume).mx.m_floats;
      bounds[1].m_floats._8_8_ = *(undefined8 *)((pbVar1->volume).mx.m_floats + 2);
      tmin = 1.0;
      bVar2 = btRayAabb2(rayFrom,&rayDirectionInverse,(uint *)&local_98,bounds,&tmin,0.0,
                         fVar8 + fVar10 + fVar9);
      iVar5 = iVar4 + -1;
      if (bVar2) {
        if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pbVar1);
        }
        else {
          if (iVar3 < iVar5) {
            local_a0 = (btDbvtNode *)0x0;
            btAlignedObjectArray<const_btDbvtNode_*>::resize(&stack,stack.m_size * 2,&local_a0);
            iVar3 = stack.m_size + -2;
          }
          stack.m_data[(long)iVar4 + -1] = (pbVar1->field_2).childs[0];
          iVar5 = iVar4 + 1;
          stack.m_data[iVar4] = (pbVar1->field_2).childs[1];
        }
      }
      iVar4 = iVar5;
    } while (iVar5 != 0);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&stack);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTest(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root)
		{
			btVector3 rayDir = (rayTo-rayFrom);
			rayDir.normalize ();

			///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
			btVector3 rayDirectionInverse;
			rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
			rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
			rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
			unsigned int signs[3] = { rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

			btScalar lambda_max = rayDir.dot(rayTo-rayFrom);

			btVector3 resultNormal;

			btAlignedObjectArray<const btDbvtNode*>	stack;

			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-2;

			stack.resize(DOUBLE_STACKSIZE);
			stack[0]=root;
			btVector3 bounds[2];
			do	{
				const btDbvtNode*	node=stack[--depth];

				bounds[0] = node->volume.Mins();
				bounds[1] = node->volume.Maxs();
				
				btScalar tmin=1.f,lambda_min=0.f;
				unsigned int result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);

#ifdef COMPARE_BTRAY_AABB2
				btScalar param=1.f;
				bool result2 = btRayAabb(rayFrom,rayTo,node->volume.Mins(),node->volume.Maxs(),param,resultNormal);
				btAssert(result1 == result2);
#endif //TEST_BTRAY_AABB2

				if(result1)
				{
					if(node->isinternal())
					{
						if(depth>treshold)
						{
							stack.resize(stack.size()*2);
							treshold=stack.size()-2;
						}
						stack[depth++]=node->childs[0];
						stack[depth++]=node->childs[1];
					}
					else
					{
						policy.Process(node);
					}
				}
			} while(depth);

		}
}